

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O2

size_t polyscope::pick::localIndexToGlobal(pair<polyscope::Structure_*,_unsigned_long> localPick)

{
  iterator iVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  long in_RSI;
  long in_RDI;
  allocator local_39;
  key_type local_38;
  long local_30;
  string local_28;
  
  if (in_RDI == 0) {
    sVar3 = 0;
  }
  else {
    local_30 = in_RSI;
    iVar1 = std::
            _Hashtable<polyscope::Structure_*,_std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<polyscope::Structure_*>,_std::hash<polyscope::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<polyscope::Structure_*,_std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<polyscope::Structure_*>,_std::hash<polyscope::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&structureRanges,&local_38);
    if (iVar1.
        super__Node_iterator_base<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_28,"structure does not match any allocated pick range",&local_39);
      exception(&local_28);
      std::__cxx11::string::~string((string *)&local_28);
    }
    pmVar2 = std::__detail::
             _Map_base<polyscope::Structure_*,_std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<polyscope::Structure_*>,_std::hash<polyscope::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<polyscope::Structure_*,_std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<polyscope::Structure_*>,_std::hash<polyscope::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&structureRanges,&local_38);
    sVar3 = local_30 +
            (pmVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  }
  return sVar3;
}

Assistant:

size_t localIndexToGlobal(std::pair<Structure*, size_t> localPick) {
  if (localPick.first == nullptr) return 0;

  if (structureRanges.find(localPick.first) == structureRanges.end()) {
    exception("structure does not match any allocated pick range");
  }

  std::tuple<size_t, size_t> range = structureRanges[localPick.first];
  size_t rangeStart = std::get<0>(range);
  size_t rangeEnd = std::get<1>(range);
  return rangeStart + localPick.second;
}